

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseAssign.h
# Opt level: O2

void Eigen::internal::
     assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::SparseMatrix<double,0,int>const,Eigen::SparseMatrix<double,0,int>const>>
               (SparseMatrix<double,_0,_int> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
               *src)

{
  long lVar1;
  Scalar SVar2;
  Scalar *pSVar3;
  Index cols;
  Index j;
  long lVar4;
  SrcEvaluatorType srcEvaluator;
  SparseMatrix<double,_0,_int> temp;
  InnerIterator it;
  binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
  local_108;
  SparseMatrix<double,_0,_int> local_e0;
  InnerIterator local_98;
  
  local_108.m_lhsImpl.super_evaluator<Eigen::SparseMatrix<double,_0,_int>_>.
  super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.m_matrix =
       src->m_lhs;
  local_108.m_lhsImpl.super_evaluator<Eigen::SparseMatrix<double,_0,_int>_>.
  super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.m_zero = 0.0;
  local_108.m_rhsImpl.super_evaluator<Eigen::SparseMatrix<double,_0,_int>_>.
  super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.m_matrix =
       src->m_rhs;
  local_108.m_rhsImpl.super_evaluator<Eigen::SparseMatrix<double,_0,_int>_>.
  super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.m_zero = 0.0;
  cols = (local_108.m_rhsImpl.super_evaluator<Eigen::SparseMatrix<double,_0,_int>_>.
          super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.
         m_matrix)->m_outerSize;
  if ((src->
      super_CwiseBinaryOpImpl<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>,_Eigen::Sparse>
      ).
      super_SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
      .m_isRValue == true) {
    SparseMatrix<double,_0,_int>::resize
              (dst,(local_108.m_rhsImpl.super_evaluator<Eigen::SparseMatrix<double,_0,_int>_>.
                    super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>
                   .m_matrix)->m_innerSize,cols);
    SparseMatrix<double,_0,_int>::setZero(dst);
    lVar4 = src->m_rhs->m_outerSize;
    lVar1 = src->m_rhs->m_innerSize;
    if (lVar4 < lVar1) {
      lVar4 = lVar1;
    }
    CompressedStorage<double,_int>::reserve(&dst->m_data,lVar4 * 2);
    lVar4 = 0;
    if (cols < 1) {
      cols = lVar4;
    }
    for (; lVar4 != cols; lVar4 = lVar4 + 1) {
      dst->m_outerIndex[lVar4 + 1] = dst->m_outerIndex[lVar4];
      binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
      ::InnerIterator::InnerIterator(&local_98,&local_108,lVar4);
      while (SVar2 = local_98.m_value, -1 < (long)local_98.m_id) {
        pSVar3 = SparseMatrix<double,_0,_int>::insertBackByOuterInner(dst,lVar4,(long)local_98.m_id)
        ;
        *pSVar3 = SVar2;
        binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
        ::InnerIterator::operator++(&local_98);
      }
    }
    SparseMatrix<double,_0,_int>::finalize(dst);
  }
  else {
    SparseMatrix<double,_0,_int>::SparseMatrix
              (&local_e0,
               (local_108.m_rhsImpl.super_evaluator<Eigen::SparseMatrix<double,_0,_int>_>.
                super_evaluator<Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>_>.
               m_matrix)->m_innerSize,cols);
    lVar4 = src->m_rhs->m_outerSize;
    lVar1 = src->m_rhs->m_innerSize;
    if (lVar4 < lVar1) {
      lVar4 = lVar1;
    }
    CompressedStorage<double,_int>::reserve(&local_e0.m_data,lVar4 * 2);
    lVar4 = 0;
    if (cols < 1) {
      cols = lVar4;
    }
    for (; lVar4 != cols; lVar4 = lVar4 + 1) {
      local_e0.m_outerIndex[lVar4 + 1] = local_e0.m_outerIndex[lVar4];
      binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
      ::InnerIterator::InnerIterator(&local_98,&local_108,lVar4);
      while (SVar2 = local_98.m_value, -1 < (long)local_98.m_id) {
        pSVar3 = SparseMatrix<double,_0,_int>::insertBackByOuterInner
                           (&local_e0,lVar4,(long)local_98.m_id);
        *pSVar3 = SVar2;
        binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
        ::InnerIterator::operator++(&local_98);
      }
    }
    SparseMatrix<double,_0,_int>::finalize(&local_e0);
    local_e0.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
    super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
         (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)true;
    SparseMatrix<double,_0,_int>::operator=(dst,&local_e0);
    SparseMatrix<double,_0,_int>::~SparseMatrix(&local_e0);
  }
  return;
}

Assistant:

void assign_sparse_to_sparse(DstXprType &dst, const SrcXprType &src)
{
  typedef typename DstXprType::Scalar Scalar;
  typedef internal::evaluator<DstXprType> DstEvaluatorType;
  typedef internal::evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  const bool transpose = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit);
  const Index outerEvaluationSize = (SrcEvaluatorType::Flags&RowMajorBit) ? src.rows() : src.cols();
  if ((!transpose) && src.isRValue())
  {
    // eval without temporary
    dst.resize(src.rows(), src.cols());
    dst.setZero();
    dst.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      dst.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        dst.insertBackByOuterInner(j,it.index()) = v;
      }
    }
    dst.finalize();
  }
  else
  {
    // eval through a temporary
    eigen_assert(( ((internal::traits<DstXprType>::SupportedAccessPatterns & OuterRandomAccessPattern)==OuterRandomAccessPattern) ||
              (!((DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit)))) &&
              "the transpose operation is supposed to be handled in SparseMatrix::operator=");

    enum { Flip = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit) };

    
    DstXprType temp(src.rows(), src.cols());

    temp.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      temp.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        temp.insertBackByOuterInner(Flip?it.index():j,Flip?j:it.index()) = v;
      }
    }
    temp.finalize();

    dst = temp.markAsRValue();
  }
}